

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O0

void __thiscall
libtorrent::anon_unknown_5::ut_metadata_peer_plugin::ut_metadata_peer_plugin
          (ut_metadata_peer_plugin *this,torrent *t,bt_peer_connection *pc,ut_metadata_plugin *tp)

{
  time_point tVar1;
  ut_metadata_plugin *tp_local;
  bt_peer_connection *pc_local;
  torrent *t_local;
  ut_metadata_peer_plugin *this_local;
  
  peer_plugin::peer_plugin(&this->super_peer_plugin);
  ::std::enable_shared_from_this<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>::
  enable_shared_from_this
            (&this->
              super_enable_shared_from_this<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>
            );
  (this->super_peer_plugin)._vptr_peer_plugin = (_func_int **)&PTR__ut_metadata_peer_plugin_00b952a0
  ;
  this->m_message_index = 0;
  tVar1 = min_time();
  (this->m_request_limit).__d.__r = (rep)tVar1.__d.__r;
  ::std::vector<int,_std::allocator<int>_>::vector(&this->m_sent_requests);
  ::std::vector<int,_std::allocator<int>_>::vector(&this->m_incoming_requests);
  this->m_torrent = t;
  this->m_pc = pc;
  this->m_tp = tp;
  return;
}

Assistant:

ut_metadata_peer_plugin(aux::torrent& t, aux::bt_peer_connection& pc
			, ut_metadata_plugin& tp)
			: m_message_index(0)
			, m_request_limit(min_time())
			, m_torrent(t)
			, m_pc(pc)
			, m_tp(tp)
		{}